

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpPackedFixed<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  FieldEntry *pFVar3;
  ParseContext *p;
  MessageLite *x;
  bool bVar4;
  unsigned_short uVar5;
  uint32_t uVar6;
  uint uVar7;
  char *pcVar8;
  LogMessage *pLVar9;
  uint *puVar10;
  ulong uVar11;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1a0 [2];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_190;
  RepeatedField<unsigned_int> *local_188;
  RepeatedField<unsigned_int> *field_1;
  Voidify local_16d;
  unsigned_short local_16c;
  unsigned_short local_16a;
  Nullable<const_char_*> local_168;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  RepeatedField<unsigned_long> *field;
  uint16_t rep;
  void *pvStack_150;
  int size;
  void *base;
  uint local_140;
  uint16_t local_13a;
  uint32_t decoded_wiretype;
  uint16_t type_card;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_f8;
  TcFieldData local_f0;
  undefined1 local_e1;
  FieldEntry *pFStack_e0;
  bool always_return;
  TcParseTableBase *local_d8;
  ParseContext *local_d0;
  ParseContext *local_c8;
  MessageLite *local_c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_a8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  
  entry = (FieldEntry *)hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar6 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  _decoded_wiretype =
       RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar6);
  local_13a = _decoded_wiretype->type_card;
  uVar6 = TcFieldData::tag((TcFieldData *)&msg_local);
  local_140 = uVar6 & 7;
  if (local_140 != 2) {
    base = msg_local;
    pcVar8 = MpRepeatedFixed<false>
                       ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                        (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar8;
  }
  pvStack_150 = MaybeGetSplitBase((MessageLite *)ptr_local,false,(TcParseTableBase *)hasbits_local);
  field._4_4_ = ReadSize((char **)&ctx_local);
  field._2_2_ = local_13a & 0x1c0;
  if (field._2_2_ == 0xc0) {
    absl_log_internal_check_op_result =
         (Nullable<const_char_*>)
         MaybeCreateRepeatedFieldRefAt<unsigned_long,false>
                   (pvStack_150,(ulong)_decoded_wiretype->offset,(MessageLite *)ptr_local);
    ctx_local = (ParseContext *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                          ((EpsCopyInputStream *)table_local,(char *)ctx_local,field._4_4_,
                           (RepeatedField<unsigned_long> *)absl_log_internal_check_op_result);
  }
  else {
    local_16a = absl::lts_20250127::log_internal::GetReferenceableValue(field._2_2_);
    local_16c = absl::lts_20250127::log_internal::GetReferenceableValue(0x80);
    local_168 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                          (&local_16a,&local_16c,
                           "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    if (local_168 != (Nullable<const_char_*>)0x0) {
      pcVar8 = absl::lts_20250127::implicit_cast<char_const*>(local_168);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&field_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x7e4,pcVar8);
      pLVar9 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&field_1);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_16d,pLVar9);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&field_1);
    }
    local_188 = MaybeCreateRepeatedFieldRefAt<unsigned_int,false>
                          (pvStack_150,(ulong)_decoded_wiretype->offset,(MessageLite *)ptr_local);
    ctx_local = (ParseContext *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                          ((EpsCopyInputStream *)table_local,(char *)ctx_local,field._4_4_,local_188
                          );
  }
  pcVar8 = ptr_local;
  pPVar2 = ctx_local;
  pTVar1 = table_local;
  if (ctx_local == (ParseContext *)0x0) {
    TcFieldData::TcFieldData((TcFieldData *)&local_190);
    pcVar8 = Error((MessageLite *)pcVar8,(char *)0x0,(ParseContext *)pTVar1,(TcFieldData)local_190,
                   (TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar8;
  }
  TcFieldData::TcFieldData((TcFieldData *)local_1a0);
  local_b8 = local_1a0[0];
  local_c0 = (MessageLite *)pcVar8;
  local_c8 = pPVar2;
  local_d0 = (ParseContext *)pTVar1;
  local_d8 = (TcParseTableBase *)hasbits_local;
  pFStack_e0 = entry;
  local_e1 = 0;
  bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)pTVar1,(char *)pPVar2);
  x = local_c0;
  p = local_c8;
  pPVar2 = local_d0;
  if (!bVar4) {
    TcFieldData::TcFieldData(&local_f0);
    if (local_d8->has_bits_offset != 0) {
      uVar7 = (uint)pFStack_e0;
      puVar10 = RefAt<unsigned_int>(x,(ulong)(uint)local_d8->has_bits_offset);
      *puVar10 = uVar7 | *puVar10;
    }
    return (char *)p;
  }
  TcFieldData::TcFieldData(&local_f8);
  pTVar1 = local_d8;
  pFVar3 = pFStack_e0;
  uVar5 = UnalignedLoad<unsigned_short>((char *)p);
  uVar11 = (ulong)(int)((uint)uVar5 & (uint)pTVar1->fast_idx_mask);
  if ((uVar11 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  data_1.field_0 =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(pTVar1,uVar11 >> 3);
  local_a8.data =
       ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
       (ulong)uVar5;
  UNRECOVERED_JUMPTABLE = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0)
  ;
  local_b0.data = local_a8.data;
  pcVar8 = (*UNRECOVERED_JUMPTABLE)
                     (x,(char *)p,pPVar2,(TcFieldData)local_a8,pTVar1,(uint64_t)pFVar3);
  return pcVar8;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpPackedFixed(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_wiretype = data.tag() & 7;

  // Check for non-packed repeated fallback:
  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpRepeatedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  int size = ReadSize(&ptr);
  uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    auto& field = MaybeCreateRepeatedFieldRefAt<uint64_t, is_split>(
        base, entry.offset, msg);
    ptr = ctx->ReadPackedFixed(ptr, size, &field);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    auto& field = MaybeCreateRepeatedFieldRefAt<uint32_t, is_split>(
        base, entry.offset, msg);
    ptr = ctx->ReadPackedFixed(ptr, size, &field);
  }

  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}